

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

QList<QModelIndex> * __thiscall
QIconModeViewBase::intersectingSet
          (QList<QModelIndex> *__return_storage_ptr__,QIconModeViewBase *this,QRect *area)

{
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
  this->interSectingVector = __return_storage_ptr__;
  QBspTree::climbTree(&this->tree,area,addLeaf,(QBspTreeData)this);
  this->interSectingVector = (QList<QModelIndex> *)0x0;
  return __return_storage_ptr__;
}

Assistant:

QList<QModelIndex> QIconModeViewBase::intersectingSet(const QRect &area) const
{
    QIconModeViewBase *that = const_cast<QIconModeViewBase*>(this);
    QBspTree::Data data(static_cast<void*>(that));
    QList<QModelIndex> res;
    that->interSectingVector = &res;
    that->tree.climbTree(area, &QIconModeViewBase::addLeaf, data);
    that->interSectingVector = nullptr;
    return res;
}